

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBaseExc.cpp
# Opt level: O0

void anon_unknown.dwarf_3b19::testThrowErrnoExc<Iex_3_2::ElibscnExc>(int err)

{
  int in_EDI;
  ElibscnExc *e;
  exception *e_1;
  bool caught;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_29;
  string local_28 [35];
  byte local_5;
  int local_4;
  
  local_5 = 0;
  local_4 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Iex_3_2::throwErrnoExc(local_28,local_4);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  if ((local_5 & 1) != 0) {
    return;
  }
  __assert_fail("caught",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/IexTest/testBaseExc.cpp"
                ,0x11c,
                "void (anonymous namespace)::testThrowErrnoExc(int) [T = Iex_3_2::ElibscnExc]");
}

Assistant:

void
testThrowErrnoExc(int err)
{
    bool caught = false;
    
    try
    {
        IEX_INTERNAL_NAMESPACE::throwErrnoExc("err", err);
    }
    catch (const T& e)
    {
        caught = true;
    }
    catch (const std::exception& e)
    {
        std::cerr << "testThrowErrnoExc: caught " << typeid(e).name()
                  << ", expected " << typeid(T).name()
                  << std::endl;
    }
    
    assert (caught);
}